

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  undefined8 uVar4;
  uint uVar5;
  U32 UVar6;
  size_t sVar7;
  bool bVar8;
  undefined8 in_stack_ffffffffffffff94;
  uint local_64;
  U32 cycleLog;
  U32 srcLog;
  U32 tSize;
  size_t dictSize_local;
  unsigned_long_long srcSize_local;
  
  ZVar3 = cPar;
  uVar2 = cPar._0_8_;
  uVar4 = cPar._8_8_;
  auVar1 = cPar._8_20_;
  cParams._20_8_ = in_stack_ffffffffffffff94;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  sVar7 = ZSTD_checkCParams(cParams);
  if (sVar7 != 0) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2e4f,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t)"
                 );
  }
  dictSize_local = srcSize;
  if ((dictSize != 0) && (srcSize == 0xffffffffffffffff)) {
    dictSize_local = 0x201;
  }
  cPar._0_8_ = uVar2;
  if ((dictSize_local < 0x40000000) && (dictSize < 0x40000000)) {
    uVar5 = (int)dictSize_local + (int)dictSize;
    if (uVar5 < 0x40) {
      local_64 = 6;
    }
    else {
      UVar6 = ZSTD_highbit32(uVar5 - 1);
      local_64 = UVar6 + 1;
    }
    bVar8 = local_64 < cPar.windowLog;
    if (bVar8) {
      cPar.windowLog = local_64;
    }
  }
  uVar2 = cPar._0_8_;
  cPar.hashLog = ZVar3.hashLog;
  bVar8 = cPar.windowLog + 1 < cPar.hashLog;
  cPar._8_8_ = uVar4;
  if (bVar8) {
    cPar.hashLog = cPar.windowLog + 1;
  }
  UVar6 = ZSTD_cycleLog(cPar.chainLog,cPar.strategy);
  if (cPar.windowLog < UVar6) {
    cPar._0_8_ = cPar._0_8_ & 0xffffffff;
  }
  bVar8 = cPar.windowLog < 10;
  cPar._0_8_ = uVar2;
  if (bVar8) {
    cPar.windowLog = 10;
  }
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  __return_storage_ptr__->minMatch = cPar.minMatch;
  __return_storage_ptr__->targetLength = cPar.targetLength;
  __return_storage_ptr__->strategy = cPar.strategy;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
        srcSize = minSrcSize;

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}